

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool adios2sys::SystemTools::FileExists(char *filename)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  if (filename == (char *)0x0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,filename,&local_31);
    bVar1 = FileExists(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool SystemTools::FileExists(const char* filename)
{
  if (!filename) {
    return false;
  }
  return SystemTools::FileExists(std::string(filename));
}